

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O3

void __thiscall
wallet::LegacyScriptPubKeyMan::AddHDChain(LegacyScriptPubKeyMan *this,CHDChain *chain)

{
  undefined1 *puVar1;
  CHDChain *chain_00;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  int64_t iVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  bool bVar8;
  int iVar9;
  undefined4 extraout_var;
  uchar *puVar11;
  runtime_error *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock30;
  unique_lock<std::recursive_mutex> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  WalletBatch local_50;
  size_type local_40;
  undefined8 uStack_38;
  long local_30;
  WalletDatabase *pWVar10;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_80._M_device =
       &(this->super_LegacyDataSPKM).super_FillableSigningProvider.cs_KeyStore.super_recursive_mutex
  ;
  local_80._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_80);
  iVar9 = (*((this->super_LegacyDataSPKM).super_ScriptPubKeyMan.m_storage)->_vptr_WalletStorage[3])
                    ();
  pWVar10 = (WalletDatabase *)CONCAT44(extraout_var,iVar9);
  (*pWVar10->_vptr_WalletDatabase[0xe])(&local_50,pWVar10,1);
  local_50.m_database = pWVar10;
  bVar8 = WalletBatch::WriteHDChain(&local_50,chain);
  if (local_50.m_batch._M_t.
      super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>._M_t
      .super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>.
      super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>)0x0) {
    (**(code **)(*(size_type *)
                  local_50.m_batch._M_t.
                  super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
                  .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl + 0x28))();
  }
  if (bVar8) {
    puVar1 = &(this->super_LegacyDataSPKM).m_hd_chain.field_0x1c;
    puVar11 = std::
              __find_if<unsigned_char_const*,__gnu_cxx::__ops::_Iter_negate<base_blob<160u>::IsNull()const::_lambda(unsigned_char)_1_>>
                        (&(this->super_LegacyDataSPKM).m_hd_chain.seed_id,puVar1);
    chain_00 = &(this->super_LegacyDataSPKM).m_hd_chain;
    if (puVar11 != puVar1) {
      LegacyDataSPKM::AddInactiveHDChain(&this->super_LegacyDataSPKM,chain_00);
    }
    (this->super_LegacyDataSPKM).m_hd_chain.nVersion = chain->nVersion;
    uVar6 = chain->nExternalChainCounter;
    uVar7 = chain->nInternalChainCounter;
    uVar2 = *(undefined8 *)(chain->seed_id).super_uint160.super_base_blob<160U>.m_data._M_elems;
    uVar3 = *(undefined8 *)
             ((chain->seed_id).super_uint160.super_base_blob<160U>.m_data._M_elems + 8);
    uVar4 = *(undefined8 *)
             ((chain->seed_id).super_uint160.super_base_blob<160U>.m_data._M_elems + 0x10);
    iVar5 = chain->m_next_internal_index;
    (this->super_LegacyDataSPKM).m_hd_chain.m_next_external_index = chain->m_next_external_index;
    (this->super_LegacyDataSPKM).m_hd_chain.m_next_internal_index = iVar5;
    *(undefined8 *)
     ((this->super_LegacyDataSPKM).m_hd_chain.seed_id.super_uint160.super_base_blob<160U>.m_data.
      _M_elems + 8) = uVar3;
    *(undefined8 *)
     ((this->super_LegacyDataSPKM).m_hd_chain.seed_id.super_uint160.super_base_blob<160U>.m_data.
      _M_elems + 0x10) = uVar4;
    chain_00->nExternalChainCounter = uVar6;
    chain_00->nInternalChainCounter = uVar7;
    *(undefined8 *)
     (this->super_LegacyDataSPKM).m_hd_chain.seed_id.super_uint160.super_base_blob<160U>.m_data.
     _M_elems = uVar2;
    std::unique_lock<std::recursive_mutex>::~unique_lock(&local_80);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      return;
    }
  }
  else {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"AddHDChain","");
    pbVar12 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              append(&local_70,": writing chain failed");
    local_50.m_batch._M_t.
    super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>._M_t.
    super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>.
    super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl =
         (__uniq_ptr_data<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>,_true,_true>
          )(pbVar12->_M_dataplus)._M_p;
    paVar13 = &pbVar12->field_2;
    if (local_50.m_batch._M_t.
        super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>.
        _M_t.
        super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
        .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl ==
        (__uniq_ptr_data<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>,_true,_true>
         )paVar13) {
      local_40 = paVar13->_M_allocated_capacity;
      uStack_38 = *(undefined8 *)((long)&pbVar12->field_2 + 8);
      local_50.m_batch._M_t.
      super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>._M_t
      .super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>.
      super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl =
           (__uniq_ptr_data<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>,_true,_true>
            )(__uniq_ptr_data<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>,_true,_true>
              )&local_40;
    }
    else {
      local_40 = paVar13->_M_allocated_capacity;
    }
    local_50.m_database = (WalletDatabase *)pbVar12->_M_string_length;
    (pbVar12->_M_dataplus)._M_p = (pointer)paVar13;
    pbVar12->_M_string_length = 0;
    (pbVar12->field_2)._M_local_buf[0] = '\0';
    std::runtime_error::runtime_error(this_00,(string *)&local_50);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  __stack_chk_fail();
}

Assistant:

void LegacyScriptPubKeyMan::AddHDChain(const CHDChain& chain)
{
    LOCK(cs_KeyStore);
    // Store the new chain
    if (!WalletBatch(m_storage.GetDatabase()).WriteHDChain(chain)) {
        throw std::runtime_error(std::string(__func__) + ": writing chain failed");
    }
    // When there's an old chain, add it as an inactive chain as we are now rotating hd chains
    if (!m_hd_chain.seed_id.IsNull()) {
        AddInactiveHDChain(m_hd_chain);
    }

    m_hd_chain = chain;
}